

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Track::GetNext(Track *this,BlockEntry *pCurrEntry,BlockEntry **pNextEntry)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  Cluster *this_00;
  BlockEntry *pBVar5;
  
  if (pCurrEntry == (BlockEntry *)0x0) {
    __assert_fail("pCurrEntry",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x127d,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  iVar2 = (*pCurrEntry->_vptr_BlockEntry[3])(pCurrEntry);
  if (iVar2 == 0) {
    __assert_fail("!pCurrEntry->EOS()",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x127e,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  iVar2 = (*pCurrEntry->_vptr_BlockEntry[2])(pCurrEntry);
  if ((CONCAT44(extraout_var,iVar2) == 0) ||
     (*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) != (this->m_info).number)) {
    __assert_fail("pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1281,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  this_00 = pCurrEntry->m_pCluster;
  if (this_00 == (Cluster *)0x0) {
    __assert_fail("pCluster",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1286,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  if (this_00->m_pSegment == (Segment *)0x0) {
    __assert_fail("!pCluster->EOS()",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1287,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  lVar4 = Cluster::GetNext(this_00,pCurrEntry,pNextEntry);
  if (lVar4 < 0) {
    return lVar4;
  }
  iVar2 = 0;
  do {
    while (*pNextEntry != (BlockEntry *)0x0) {
      iVar3 = (*(*pNextEntry)->_vptr_BlockEntry[2])();
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        __assert_fail("pNextBlock",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1291,
                      "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const"
                     );
      }
      if (*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x10) == (this->m_info).number) {
        return 0;
      }
      lVar4 = Cluster::GetNext(this_00,*pNextEntry,pNextEntry);
      if (lVar4 < 0) {
        return lVar4;
      }
    }
    this_00 = Segment::GetNext(this->m_pSegment,this_00);
    if (this_00 == (Cluster *)0x0) break;
    if (this_00->m_pSegment == (Segment *)0x0) {
      bVar1 = Segment::DoneParsing(this->m_pSegment);
      pBVar5 = &(this->m_eos).super_BlockEntry;
      if (!bVar1) {
        pBVar5 = (BlockEntry *)0x0;
      }
      lVar4 = (ulong)bVar1 * 4 + -3;
      goto LAB_00116c85;
    }
    lVar4 = Cluster::GetFirst(this_00,pNextEntry);
    if (lVar4 < 0) {
      return lVar4;
    }
  } while ((*pNextEntry == (BlockEntry *)0x0) || (iVar2 = iVar2 + 1, iVar2 != 100));
  pBVar5 = &(this->m_eos).super_BlockEntry;
  lVar4 = 1;
LAB_00116c85:
  *pNextEntry = pBVar5;
  return lVar4;
}

Assistant:

long Track::GetNext(const BlockEntry* pCurrEntry,
                    const BlockEntry*& pNextEntry) const {
  assert(pCurrEntry);
  assert(!pCurrEntry->EOS());  //?

  const Block* const pCurrBlock = pCurrEntry->GetBlock();
  assert(pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number);
  if (!pCurrBlock || pCurrBlock->GetTrackNumber() != m_info.number)
    return -1;

  const Cluster* pCluster = pCurrEntry->GetCluster();
  assert(pCluster);
  assert(!pCluster->EOS());

  long status = pCluster->GetNext(pCurrEntry, pNextEntry);

  if (status < 0)  // error
    return status;

  for (int i = 0;;) {
    while (pNextEntry) {
      const Block* const pNextBlock = pNextEntry->GetBlock();
      assert(pNextBlock);

      if (pNextBlock->GetTrackNumber() == m_info.number)
        return 0;

      pCurrEntry = pNextEntry;

      status = pCluster->GetNext(pCurrEntry, pNextEntry);

      if (status < 0)  // error
        return status;
    }

    pCluster = m_pSegment->GetNext(pCluster);

    if (pCluster == NULL) {
      pNextEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pNextEntry = GetEOS();
        return 1;
      }

      // TODO: there is a potential O(n^2) problem here: we tell the
      // caller to (pre)load another cluster, which he does, but then he
      // calls GetNext again, which repeats the same search.  This is
      // a pathological case, since the only way it can happen is if
      // there exists a long sequence of clusters none of which contain a
      // block from this track.  One way around this problem is for the
      // caller to be smarter when he loads another cluster: don't call
      // us back until you have a cluster that contains a block from this
      // track. (Of course, that's not cheap either, since our caller
      // would have to scan the each cluster as it's loaded, so that
      // would just push back the problem.)

      pNextEntry = NULL;
      return E_BUFFER_NOT_FULL;
    }

    status = pCluster->GetFirst(pNextEntry);

    if (status < 0)  // error
      return status;

    if (pNextEntry == NULL)  // empty cluster
      continue;

    ++i;

    if (i >= 100)
      break;
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number after lots of searching, so we give
  // up trying.

  pNextEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}